

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O2

void ZCC_InitConversions(void)

{
  PType::AddConversion((PType *)TypeUInt8,(PType *)TypeSInt32,IntToS32);
  PType::AddConversion((PType *)TypeSInt8,(PType *)TypeSInt32,IntToS32);
  PType::AddConversion((PType *)TypeUInt16,(PType *)TypeSInt32,IntToS32);
  PType::AddConversion((PType *)TypeSInt16,(PType *)TypeSInt32,IntToS32);
  PType::AddConversion((PType *)TypeUInt32,(PType *)TypeSInt32,IntToS32);
  PType::AddConversion((PType *)TypeUInt32,(PType *)TypeFloat64,U32toD);
  PType::AddConversion((PType *)TypeUInt32,(PType *)TypeString,U32toS);
  PType::AddConversion((PType *)TypeSInt32,(PType *)TypeUInt8,S32toU8);
  PType::AddConversion((PType *)TypeSInt32,(PType *)TypeSInt8,S32toS8);
  PType::AddConversion((PType *)TypeSInt32,(PType *)TypeSInt16,S32toS16);
  PType::AddConversion((PType *)TypeSInt32,(PType *)TypeUInt16,S32toU16);
  PType::AddConversion((PType *)TypeSInt32,(PType *)TypeUInt32,S32toU32);
  PType::AddConversion((PType *)TypeSInt32,(PType *)TypeFloat64,S32toD);
  PType::AddConversion((PType *)TypeSInt32,(PType *)TypeString,S32toS);
  PType::AddConversion((PType *)TypeFloat32,(PType *)TypeFloat64,FtoD);
  PType::AddConversion((PType *)TypeFloat64,(PType *)TypeUInt32,DtoU32);
  PType::AddConversion((PType *)TypeFloat64,(PType *)TypeSInt32,DtoS32);
  PType::AddConversion((PType *)TypeFloat64,(PType *)TypeFloat32,DtoF);
  PType::AddConversion((PType *)TypeFloat64,(PType *)TypeString,DtoS);
  return;
}

Assistant:

void ZCC_InitConversions()
{
	TypeUInt8->AddConversion(TypeSInt32, IntToS32);
	TypeSInt8->AddConversion(TypeSInt32, IntToS32);
	TypeUInt16->AddConversion(TypeSInt32, IntToS32);
	TypeSInt16->AddConversion(TypeSInt32, IntToS32);

	TypeUInt32->AddConversion(TypeSInt32, IntToS32);
	TypeUInt32->AddConversion(TypeFloat64, U32toD);
	TypeUInt32->AddConversion(TypeString, U32toS);

	TypeSInt32->AddConversion(TypeUInt8, S32toU8);
	TypeSInt32->AddConversion(TypeSInt8, S32toS8);
	TypeSInt32->AddConversion(TypeSInt16, S32toS16);
	TypeSInt32->AddConversion(TypeUInt16, S32toU16);
	TypeSInt32->AddConversion(TypeUInt32, S32toU32);
	TypeSInt32->AddConversion(TypeFloat64, S32toD);
	TypeSInt32->AddConversion(TypeString, S32toS);

	TypeFloat32->AddConversion(TypeFloat64, FtoD);

	TypeFloat64->AddConversion(TypeUInt32, DtoU32);
	TypeFloat64->AddConversion(TypeSInt32, DtoS32);
	TypeFloat64->AddConversion(TypeFloat32, DtoF);
	TypeFloat64->AddConversion(TypeString, DtoS);
}